

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::XmlReporter::log_message(XmlReporter *this,MessageData *mb)

{
  XmlWriter *pXVar1;
  char *pcVar2;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [16];
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> DOCTEST_ANON_LOCK_4;
  MessageData *mb_local;
  XmlReporter *this_local;
  
  DOCTEST_ANON_LOCK_4._M_device = (mutex_type *)mb;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Message",&local_41);
  pXVar1 = XmlWriter::startElement(&this->xml,&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"type",&local_79);
  pcVar2 = failureString(*(Enum *)((long)&((DOCTEST_ANON_LOCK_4._M_device)->super___mutex_base).
                                          _M_mutex + 0x24));
  pXVar1 = XmlWriter::writeAttribute(pXVar1,&local_78,pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"filename",&local_a1);
  pcVar2 = skipPathFromFilename
                     ((char *)((DOCTEST_ANON_LOCK_4._M_device)->super___mutex_base)._M_mutex.__data.
                              __list.__prev);
  pXVar1 = XmlWriter::writeAttribute(pXVar1,&local_a0,pcVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"line",(allocator<char> *)(local_d8 + 0xf));
  local_d8._8_4_ =
       line(this,*(uint *)((long)&((DOCTEST_ANON_LOCK_4._M_device)->super___mutex_base)._M_mutex +
                          0x20));
  XmlWriter::writeAttribute<unsigned_int>(pXVar1,&local_c8,(uint *)(local_d8 + 8));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0xf));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"Text",&local_f9);
  XmlWriter::scopedElement((XmlWriter *)local_d8,(string *)&this->xml);
  pcVar2 = String::c_str((String *)DOCTEST_ANON_LOCK_4._M_device);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar2,&local_121);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_d8,&local_120,true);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  log_contexts(this);
  XmlWriter::endElement(&this->xml);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void log_message(const MessageData& mb) override {
            DOCTEST_LOCK_MUTEX(mutex)

            xml.startElement("Message")
                    .writeAttribute("type", failureString(mb.m_severity))
                    .writeAttribute("filename", skipPathFromFilename(mb.m_file))
                    .writeAttribute("line", line(mb.m_line));

            xml.scopedElement("Text").writeText(mb.m_string.c_str());

            log_contexts();

            xml.endElement();
        }